

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.h
# Opt level: O0

bool anon_unknown.dwarf_171f9::equal<unsigned_char>(uchar x,uchar y)

{
  uchar y_local;
  uchar x_local;
  
  return x == y;
}

Assistant:

bool equal(float x, float y)
    {
        float r = x-y;
        if (r < 0)
            r = y-x;
        if (r < epsilon<float>())
            return true;
        return false;
    }